

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShower::hsvEd(QColorShower *this)

{
  int iVar1;
  QRgb QVar2;
  QColorShower *in_RDI;
  long in_FS_OFFSET;
  QColor c;
  undefined4 in_stack_ffffffffffffff88;
  QRgb in_stack_ffffffffffffff8c;
  QSpinBox *in_stack_ffffffffffffff90;
  QColSpinBox *this_00;
  QColSpinBox *in_stack_ffffffffffffff98;
  QColorShower *this_01;
  QColorShower *this_02;
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->rgbOriginal = false;
  iVar1 = QSpinBox::value(in_stack_ffffffffffffff90);
  in_RDI->hue = iVar1;
  iVar1 = QSpinBox::value(in_stack_ffffffffffffff90);
  in_RDI->sat = iVar1;
  iVar1 = QSpinBox::value(in_stack_ffffffffffffff90);
  in_RDI->val = iVar1;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QColorShower *)&local_18;
  QColor::QColor((QColor *)0x735e09);
  QColor::setHsv((int)this_02,in_RDI->hue,in_RDI->sat,in_RDI->val);
  QVar2 = QColor::rgb();
  in_RDI->curCol = QVar2;
  this_00 = in_RDI->rEd;
  QVar2 = currentColor(in_RDI);
  qRed(QVar2);
  QColSpinBox::setValue(in_stack_ffffffffffffff98,(int)((ulong)this_00 >> 0x20));
  this_01 = (QColorShower *)in_RDI->gEd;
  QVar2 = currentColor(in_RDI);
  qGreen(QVar2);
  QColSpinBox::setValue((QColSpinBox *)this_01,(int)((ulong)this_00 >> 0x20));
  QVar2 = currentColor(in_RDI);
  qBlue(QVar2);
  QColSpinBox::setValue((QColSpinBox *)this_01,(int)((ulong)this_00 >> 0x20));
  QColor::name((NameFormat)local_30);
  QLineEdit::setText((QLineEdit *)this_00,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QString::~QString((QString *)0x735eef);
  showCurrentColor(this_01);
  currentColor(in_RDI);
  newCol((QColorShower *)0x735f0f,in_stack_ffffffffffffff8c);
  updateQColor(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::hsvEd()
{
    rgbOriginal = false;
    hue = hEd->value();
    sat = sEd->value();
    val = vEd->value();

    QColor c;
    c.setHsv(hue, sat, val);
    curCol = c.rgb();

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(c.name());

    showCurrentColor();
    emit newCol(currentColor());
    updateQColor();
}